

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

_Bool sval_menu(wchar_t tval,char *desc)

{
  wchar_t count;
  char *str;
  ignore_choice *piStack_38;
  wchar_t n_choices;
  ignore_choice *choices;
  region_conflict area;
  menu_conflict *menu;
  char *desc_local;
  wchar_t tval_local;
  
  choices = (ignore_choice *)0x200000001;
  area.col = -1;
  area.row = -1;
  count = ignore_collect_kind(tval,&stack0xffffffffffffffc8);
  if (count == L'\0') {
    desc_local._7_1_ = false;
  }
  else {
    if ((1 < (uint)(tval + L'\xffffffee')) && (5 < (uint)(tval + L'\xffffffe2'))) {
      sort(piStack_38,(long)count,0x10,cmp_ignore);
    }
    screen_save();
    clear_from(L'\0');
    str = format("Ignore the following %s:",desc);
    prt(str,L'\0',L'\0');
    area._8_8_ = menu_new(MN_SKIN_COLUMNS,&ignore_sval_menu);
    menu_setpriv((menu_conflict *)area._8_8_,count,piStack_38);
    *(char **)(area._8_8_ + 0x28) = "Tt";
    menu_layout((menu_conflict *)area._8_8_,(region_conflict *)&choices);
    menu_set_cursor_x_offset((menu_conflict *)area._8_8_,1);
    menu_select((menu_conflict *)area._8_8_,0,false);
    mem_free((void *)area._8_8_);
    mem_free(piStack_38);
    screen_load();
    desc_local._7_1_ = true;
  }
  return desc_local._7_1_;
}

Assistant:

static bool sval_menu(int tval, const char *desc)
{
	struct menu *menu;
	region area = { 1, 2, -1, -1 };

	ignore_choice *choices;

	int n_choices = ignore_collect_kind(tval, &choices);
	if (!n_choices)
		return false;

	/* Sort by name in ignore menus except for categories of items that are
	 * aware from the start */
	switch (tval)
	{
		case TV_LIGHT:
		case TV_MAGIC_BOOK:
		case TV_PRAYER_BOOK:
		case TV_NATURE_BOOK:
		case TV_SHADOW_BOOK:
		case TV_OTHER_BOOK:
		case TV_DRAG_ARMOR:
		case TV_GOLD:
			/* leave sorted by sval */
			break;

		default:
			/* sort by name */
			sort(choices, n_choices, sizeof(*choices), cmp_ignore);
	}


	/* Save the screen and clear it */
	screen_save();
	clear_from(0);

	/* Help text */
	prt(format("Ignore the following %s:", desc), 0, 0);

	/* Run menu */
	menu = menu_new(MN_SKIN_COLUMNS, &ignore_sval_menu);
	menu_setpriv(menu, n_choices, choices);
	menu->cmd_keys = "Tt";
	menu_layout(menu, &area);
	menu_set_cursor_x_offset(menu, 1); /* Place cursor in brackets. */
	menu_select(menu, 0, false);

	/* Free memory */
	mem_free(menu);
	mem_free(choices);

	/* Load screen */
	screen_load();
	return true;
}